

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AddVisibilityPresetFlags
          (cmLocalGenerator *this,string *flags,cmTarget *target,string *lang)

{
  cmTarget *pcVar1;
  bool bVar2;
  PolicyStatus PVar3;
  int iVar4;
  char *pcVar5;
  char *__s1;
  ostream *poVar6;
  cmake *this_00;
  cmListFileBacktrace *bt;
  PolicyID id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  string *psVar7;
  pair<std::_Rb_tree_iterator<const_cmTarget_*>,_bool> pVar8;
  cmTarget *target_local;
  allocator local_251;
  string l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string warnCMP0063;
  string flagDefine;
  string compileOption;
  string option;
  
  if (lang->_M_string_length == 0) {
    return;
  }
  warnCMP0063._M_dataplus._M_p = (pointer)&warnCMP0063.field_2;
  warnCMP0063._M_string_length = 0;
  warnCMP0063.field_2._M_local_buf[0] = '\0';
  target_local = target;
  if (((target->TargetTypeValue & ~STATIC_LIBRARY) == SHARED_LIBRARY) ||
     (bVar2 = cmTarget::IsExecutableWithExports(target), bVar2)) {
LAB_0028aa85:
    psVar7 = (string *)0x0;
  }
  else {
    PVar3 = cmTarget::GetPolicyStatusCMP0063(target_local);
    if (PVar3 == OLD) goto LAB_0028af1a;
    if (PVar3 != WARN) goto LAB_0028aa85;
    psVar7 = &warnCMP0063;
  }
  pcVar1 = target_local;
  std::__cxx11::string::string((string *)&l,(string *)lang);
  std::operator+(&option,"CMAKE_",&l);
  std::operator+(&compileOption,&option,"_COMPILE_OPTIONS_VISIBILITY");
  std::__cxx11::string::~string((string *)&option);
  pcVar5 = cmMakefile::GetDefinition(this->Makefile,&compileOption);
  if (pcVar5 != (char *)0x0) {
    std::operator+(&flagDefine,&l,"_VISIBILITY_PRESET");
    __s1 = cmTarget::GetProperty(pcVar1,&flagDefine);
    if (__s1 != (char *)0x0) {
      if (psVar7 == (string *)0x0) {
        iVar4 = strcmp(__s1,"hidden");
        if ((((iVar4 != 0) && (iVar4 = strcmp(__s1,"default"), iVar4 != 0)) &&
            (iVar4 = strcmp(__s1,"protected"), iVar4 != 0)) &&
           (iVar4 = strcmp(__s1,"internal"), iVar4 != 0)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&option);
          poVar6 = std::operator<<((ostream *)&option,"Target ");
          poVar6 = std::operator<<(poVar6,(string *)&pcVar1->Name);
          poVar6 = std::operator<<(poVar6," uses unsupported value \"");
          poVar6 = std::operator<<(poVar6,__s1);
          poVar6 = std::operator<<(poVar6,"\" for ");
          poVar6 = std::operator<<(poVar6,(string *)&flagDefine);
          std::operator<<(poVar6,".");
          std::__cxx11::stringbuf::str();
          cmSystemTools::Error(local_228._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
          std::__cxx11::string::~string((string *)&local_228);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&option);
          goto LAB_0028acf2;
        }
        std::__cxx11::string::string((string *)&local_228,pcVar5,&local_251);
        std::operator+(&option,&local_228,__s1);
        std::__cxx11::string::~string((string *)&local_228);
        (*this->_vptr_cmLocalGenerator[5])(this,flags,&option);
        this_01 = &option;
      }
      else {
        std::operator+(&local_228,"  ",&flagDefine);
        std::operator+(&option,&local_228,"\n");
        std::__cxx11::string::append((string *)psVar7);
        std::__cxx11::string::~string((string *)&option);
        this_01 = &local_228;
      }
      std::__cxx11::string::~string((string *)this_01);
    }
LAB_0028acf2:
    std::__cxx11::string::~string((string *)&flagDefine);
  }
  std::__cxx11::string::~string((string *)&compileOption);
  std::__cxx11::string::~string((string *)&l);
  bVar2 = std::operator==(lang,"CXX");
  pcVar1 = target_local;
  if (bVar2) {
    std::__cxx11::string::string
              ((string *)&option,"CMAKE_CXX_COMPILE_OPTIONS_VISIBILITY_INLINES_HIDDEN",
               (allocator *)&l);
    pcVar5 = cmMakefile::GetDefinition(this->Makefile,&option);
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::string
                ((string *)&l,"VISIBILITY_INLINES_HIDDEN",(allocator *)&compileOption);
      bVar2 = cmTarget::GetPropertyAsBool(pcVar1,&l);
      std::__cxx11::string::~string((string *)&l);
      if (bVar2) {
        if (psVar7 == (string *)0x0) {
          (*this->_vptr_cmLocalGenerator[6])(this,flags,pcVar5);
        }
        else {
          std::__cxx11::string::append((char *)psVar7);
        }
      }
    }
    std::__cxx11::string::~string((string *)&option);
  }
  if ((warnCMP0063._M_string_length != 0) &&
     (pVar8 = std::
              _Rb_tree<cmTarget_const*,cmTarget_const*,std::_Identity<cmTarget_const*>,std::less<cmTarget_const*>,std::allocator<cmTarget_const*>>
              ::_M_insert_unique<cmTarget_const*const&>
                        ((_Rb_tree<cmTarget_const*,cmTarget_const*,std::_Identity<cmTarget_const*>,std::less<cmTarget_const*>,std::allocator<cmTarget_const*>>
                          *)&this->WarnCMP0063,&target_local),
     ((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&option);
    cmPolicies::GetPolicyWarning_abi_cxx11_(&l,(cmPolicies *)0x3f,id);
    poVar6 = std::operator<<((ostream *)&option,(string *)&l);
    poVar6 = std::operator<<(poVar6,"\nTarget \"");
    poVar6 = std::operator<<(poVar6,(string *)&target_local->Name);
    poVar6 = std::operator<<(poVar6,"\" of type \"");
    pcVar5 = cmTarget::GetTargetTypeName(target_local->TargetTypeValue);
    poVar6 = std::operator<<(poVar6,pcVar5);
    poVar6 = std::operator<<(poVar6,"\" has the following visibility properties set for ");
    poVar6 = std::operator<<(poVar6,(string *)lang);
    poVar6 = std::operator<<(poVar6,":\n");
    poVar6 = std::operator<<(poVar6,(string *)&warnCMP0063);
    std::operator<<(poVar6,"For compatibility CMake is not honoring them for this target.");
    std::__cxx11::string::~string((string *)&l);
    this_00 = cmMakefile::GetCMakeInstance(target_local->Makefile);
    std::__cxx11::stringbuf::str();
    bt = cmTarget::GetBacktrace(target_local);
    cmake::IssueMessage(this_00,AUTHOR_WARNING,&l,bt);
    std::__cxx11::string::~string((string *)&l);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&option);
  }
LAB_0028af1a:
  std::__cxx11::string::~string((string *)&warnCMP0063);
  return;
}

Assistant:

void cmLocalGenerator
::AddVisibilityPresetFlags(std::string &flags, cmTarget const* target,
                            const std::string& lang)
{
  if (lang.empty())
    {
    return;
    }

  std::string warnCMP0063;
  std::string *pWarnCMP0063 = 0;
  if (target->GetType() != cmTarget::SHARED_LIBRARY &&
      target->GetType() != cmTarget::MODULE_LIBRARY &&
      !target->IsExecutableWithExports())
    {
    switch (target->GetPolicyStatusCMP0063())
      {
      case cmPolicies::OLD:
        return;
      case cmPolicies::WARN:
        pWarnCMP0063 = &warnCMP0063;
        break;
      default:
        break;
      }
    }

  AddVisibilityCompileOption(flags, target, this, lang, pWarnCMP0063);

  if(lang == "CXX")
    {
    AddInlineVisibilityCompileOption(flags, target, this, pWarnCMP0063);
    }

  if (!warnCMP0063.empty() &&
      this->WarnCMP0063.insert(target).second)
    {
    std::ostringstream w;
    w <<
      cmPolicies::GetPolicyWarning(cmPolicies::CMP0063) << "\n"
      "Target \"" << target->GetName() << "\" of "
      "type \"" << cmTarget::GetTargetTypeName(target->GetType()) << "\" "
      "has the following visibility properties set for " << lang << ":\n" <<
      warnCMP0063 <<
      "For compatibility CMake is not honoring them for this target.";
    target->GetMakefile()->GetCMakeInstance()
      ->IssueMessage(cmake::AUTHOR_WARNING, w.str(), target->GetBacktrace());
    }
}